

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

int gen_iwmmxt_shift(TCGContext_conflict1 *tcg_ctx,uint32_t insn,uint32_t mask,TCGv_i32 dest)

{
  TCGv_i32 ret;
  uint reg;
  uintptr_t o;
  
  reg = insn & 0xf;
  if ((insn >> 8 & 1) == 0) {
    ret = tcg_temp_new_i32(tcg_ctx);
    iwmmxt_load_reg(tcg_ctx,tcg_ctx->cpu_V0,reg);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret,tcg_ctx->cpu_V0);
  }
  else {
    if (reg - 0xc < 0xfffffffc) {
      return 1;
    }
    ret = iwmmxt_load_creg(tcg_ctx,reg);
  }
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,ret,mask);
  tcg_gen_mov_i32(tcg_ctx,dest,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return 0;
}

Assistant:

static inline int gen_iwmmxt_shift(TCGContext *tcg_ctx, uint32_t insn, uint32_t mask, TCGv_i32 dest)
{
    int rd = (insn >> 0) & 0xf;
    TCGv_i32 tmp;

    if (insn & (1 << 8)) {
        if (rd < ARM_IWMMXT_wCGR0 || rd > ARM_IWMMXT_wCGR3) {
            return 1;
        } else {
            tmp = iwmmxt_load_creg(tcg_ctx, rd);
        }
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        iwmmxt_load_reg(tcg_ctx, tcg_ctx->cpu_V0, rd);
        tcg_gen_extrl_i64_i32(tcg_ctx, tmp, tcg_ctx->cpu_V0);
    }
    tcg_gen_andi_i32(tcg_ctx, tmp, tmp, mask);
    tcg_gen_mov_i32(tcg_ctx, dest, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return 0;
}